

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-reincarnate.c
# Opt level: O1

void reincarnate_borg(void)

{
  int16_t *piVar1;
  ushort uVar2;
  chunk_conflict2 *pcVar3;
  loc_conflict lVar4;
  player_upkeep *ppVar5;
  player_body *ppVar6;
  bool bVar7;
  player_body *ppVar8;
  undefined6 uVar9;
  chunk_conflict *pcVar10;
  player *ppVar11;
  player *ppVar12;
  player_body *ppVar13;
  int *piVar14;
  uint8_t uVar15;
  _Bool _Var16;
  guid gVar17;
  int iVar18;
  uint32_t uVar19;
  wchar_t wVar20;
  player_race *ppVar21;
  player_class *c;
  char *pcVar22;
  equip_slot *peVar23;
  obj_property *poVar24;
  object_kind *kind;
  uint *puVar25;
  object *obj;
  object *poVar26;
  undefined1 *puVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  start_item *psVar32;
  long lVar33;
  char buf [80];
  command fake_cmd;
  char local_138 [88];
  command local_e0;
  
  ppVar11 = player;
  pcVar10 = cave;
  pcVar3 = player->cave;
  lVar4 = player->grid;
  cave = (chunk_conflict *)0x0;
  player->cave = (chunk_conflict2 *)0x0;
  piVar14 = borg.trait;
  borg.trait[0x6a] = 0;
  piVar14[0x24] = 1;
  borg_parse((char *)0x0);
  borg_clear_reactions();
  borg_flush();
  player_init(player);
  piVar14 = borg.trait;
  borg.trait[0x7b] = 0;
  piVar14[0x78] = 0;
  piVar14[0x76] = 0;
  piVar14[0x74] = 0;
  piVar14[0x75] = 0;
  borg.time_this_panel = 1;
  vault_on_level = false;
  unique_on_level = 0;
  scaryguy_on_level = false;
  breeder_level = false;
  borg.goal.leaving = false;
  borg.goal.fleeing = false;
  borg.goal.fleeing_to_town = false;
  borg.goal.ignoring = false;
  flavor_init();
  gVar17 = borg_cfg[0x15];
  if (gVar17 == 0xffffffff) {
    gVar17 = Rand_div(0xb);
  }
  ppVar21 = player_id2race(gVar17);
  gVar17 = borg_cfg[0x14];
  if (gVar17 == 0xffffffff) {
    gVar17 = Rand_div(9);
  }
  c = player_id2class(gVar17);
  player_generate(player,ppVar21,c,false);
  character_dungeon = false;
  character_generated = false;
  player->depth = 0;
  seed_flavor = Rand_div(0x10000000);
  ppVar13 = bodies;
  ppVar21 = ppVar11->race;
  wVar20 = ppVar21->body;
  ppVar6 = bodies[wVar20].next;
  pcVar22 = bodies[wVar20].name;
  ppVar8 = bodies + wVar20;
  uVar9 = *(undefined6 *)&ppVar8->field_0x12;
  peVar23 = *(equip_slot **)(&ppVar8->count + 4);
  (ppVar11->body).count = ppVar8->count;
  *(undefined6 *)&(ppVar11->body).field_0x12 = uVar9;
  (ppVar11->body).slots = peVar23;
  (ppVar11->body).next = ppVar6;
  (ppVar11->body).name = pcVar22;
  my_strcpy(local_138,ppVar13[ppVar21->body].name,0x50);
  pcVar22 = string_make(local_138);
  (ppVar11->body).name = pcVar22;
  peVar23 = (equip_slot *)mem_zalloc((ulong)(ppVar11->body).count << 5);
  (ppVar11->body).slots = peVar23;
  if ((ppVar11->body).count != 0) {
    lVar33 = 0;
    uVar31 = 0;
    do {
      peVar23 = bodies[ppVar11->race->body].slots;
      *(undefined2 *)((long)&((ppVar11->body).slots)->type + lVar33) =
           *(undefined2 *)((long)&peVar23->type + lVar33);
      my_strcpy(local_138,*(char **)((long)&peVar23->name + lVar33),0x50);
      pcVar22 = string_make(local_138);
      *(char **)((long)&((ppVar11->body).slots)->name + lVar33) = pcVar22;
      uVar31 = uVar31 + 1;
      lVar33 = lVar33 + 0x20;
    } while (uVar31 < (ppVar11->body).count);
  }
  pcVar22 = player->full_name;
  switch(player->race->ridx) {
  case 0:
  case 8:
    uVar19 = Rand_div(0x41);
    my_strcpy(pcVar22,human_syllable1_rel + *(int *)(human_syllable1_rel + (long)(int)uVar19 * 4),
              0x20);
    uVar19 = Rand_div(0x22);
    my_strcat(pcVar22,human_syllable2_rel + *(int *)(human_syllable2_rel + (long)(int)uVar19 * 4),
              0x20);
    uVar19 = Rand_div(0x46);
    lVar33 = (long)(int)uVar19;
    puVar27 = human_syllable3_rel;
    break;
  case 1:
  case 2:
  case 9:
    uVar19 = Rand_div(0x22);
    my_strcpy(pcVar22,elf_syllable1_rel + *(int *)(elf_syllable1_rel + (long)(int)uVar19 * 4),0x20);
    uVar19 = Rand_div(0x11);
    my_strcat(pcVar22,elf_syllable2_rel + *(int *)(elf_syllable2_rel + (long)(int)uVar19 * 4),0x20);
    uVar19 = Rand_div(0x1a);
    lVar33 = (long)(int)uVar19;
    puVar27 = elf_syllable3_rel;
    break;
  case 3:
    uVar19 = Rand_div(0x16);
    my_strcpy(pcVar22,hobbit_syllable1_rel + *(int *)(hobbit_syllable1_rel + (long)(int)uVar19 * 4),
              0x20);
    uVar19 = Rand_div(7);
    my_strcat(pcVar22,hobbit_syllable2_rel + *(int *)(hobbit_syllable2_rel + (long)(int)uVar19 * 4),
              0x20);
    uVar19 = Rand_div(0x19);
    lVar33 = (long)(int)uVar19;
    puVar27 = hobbit_syllable3_rel;
    break;
  case 4:
    uVar19 = Rand_div(0x21);
    my_strcpy(pcVar22,gnome_syllable1_rel + *(int *)(gnome_syllable1_rel + (long)(int)uVar19 * 4),
              0x20);
    uVar19 = Rand_div(10);
    my_strcat(pcVar22,gnome_syllable2_rel + *(int *)(gnome_syllable2_rel + (long)(int)uVar19 * 4),
              0x20);
    uVar19 = Rand_div(0x20);
    lVar33 = (long)(int)uVar19;
    puVar27 = gnome_syllable3_rel;
    break;
  case 5:
    uVar19 = Rand_div(0xf);
    my_strcpy(pcVar22,dwarf_syllable1_rel + *(int *)(dwarf_syllable1_rel + (long)(int)uVar19 * 4),
              0x20);
    uVar19 = Rand_div(6);
    my_strcat(pcVar22,dwarf_syllable2_rel + *(int *)(dwarf_syllable2_rel + (long)(int)uVar19 * 4),
              0x20);
    uVar19 = Rand_div(0x10);
    lVar33 = (long)(int)uVar19;
    puVar27 = dwarf_syllable3_rel;
    break;
  case 6:
  case 7:
  case 10:
    uVar19 = Rand_div(0xe);
    my_strcpy(pcVar22,orc_syllable1_rel + *(int *)(orc_syllable1_rel + (long)(int)uVar19 * 4),0x20);
    uVar19 = Rand_div(6);
    my_strcat(pcVar22,orc_syllable2_rel + *(int *)(orc_syllable2_rel + (long)(int)uVar19 * 4),0x20);
    uVar19 = Rand_div(0x18);
    lVar33 = (long)(int)uVar19;
    puVar27 = orc_syllable3_rel;
    break;
  default:
    *pcVar22 = '\0';
    goto LAB_00241d41;
  }
  my_strcat(pcVar22,puVar27 + *(int *)(puVar27 + lVar33 * 4),0x20);
LAB_00241d41:
  ppVar12 = player;
  uVar2 = z_info->start_gold;
  player->au_birth = (uint)uVar2;
  ppVar12->au = (uint)uVar2;
  iVar18 = (uint)ppVar12->hitdie * 0x32 + -0x32;
  iVar30 = iVar18 * 3 + 7;
  if (-1 < iVar18 * 3) {
    iVar30 = iVar18 * 3;
  }
  iVar29 = iVar18 * 5 + 7;
  if (-1 < iVar18 * 5) {
    iVar29 = iVar18 * 5;
  }
  lVar33 = 1;
  do {
    do {
      uVar19 = Rand_div((uint)player->hitdie);
      ppVar12 = player;
      player->player_hp[lVar33] = (short)uVar19 + player->player_hp[lVar33 + -1] + 1;
      lVar33 = lVar33 + 1;
    } while (lVar33 != 0x32);
    lVar33 = 1;
  } while (((int)ppVar12->player_hp[0x31] < (iVar30 >> 3) + 0x32) ||
          ((iVar29 >> 3) + 0x32 < (int)ppVar12->player_hp[0x31]));
  poVar26 = ppVar12->obj_k;
  poVar26->to_a = 1;
  poVar26->to_h = 1;
  poVar26->to_d = 1;
  player_learn_innate(ppVar12);
  player_spells_init(player);
  ppVar12 = player;
  player->upkeep->total_weight = L'\0';
  poVar26 = ppVar12->obj_k;
  poVar26->dd = '\x01';
  poVar26->ds = '\x01';
  poVar26->ac = 1;
  iVar30 = 1;
  do {
    poVar24 = lookup_obj_property(3,iVar30);
    if (poVar24->subtype == L'\x04') {
      flag_on_dbg(ppVar12->obj_k->flags,5,iVar30,"p->obj_k->flags","i");
    }
    if (poVar24->subtype == L'\a') {
      flag_on_dbg(ppVar12->obj_k->flags,5,iVar30,"p->obj_k->flags","i");
    }
    if (poVar24->subtype == L'\b') {
      flag_on_dbg(ppVar12->obj_k->flags,5,iVar30,"p->obj_k->flags","i");
    }
    iVar30 = iVar30 + 1;
  } while (iVar30 != 0x27);
  psVar32 = ppVar12->class->start_items;
  if (psVar32 != (start_item *)0x0) {
    do {
      iVar30 = rand_range(psVar32->min,psVar32->max);
      uVar15 = (uint8_t)iVar30;
      kind = lookup_kind(psVar32->tval,psVar32->sval);
      if (kind == (object_kind *)0x0) {
        __assert_fail("kind",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/borg/borg-reincarnate.c"
                      ,0x139,"void borg_outfit_player(struct player *)");
      }
      if ((ppVar12->opts).opt[0x27] == false) {
        _Var16 = tval_is_food_k(kind);
        uVar15 = '\x01';
        if ((_Var16) || (_Var16 = tval_is_light_k(kind), _Var16)) goto LAB_00241f21;
      }
      else {
LAB_00241f21:
        puVar25 = (uint *)psVar32->eopts;
        if ((puVar25 != (uint *)0x0) && (uVar28 = *puVar25, uVar28 != 0)) {
          bVar7 = true;
          do {
            puVar25 = puVar25 + 1;
            if ((int)uVar28 < 1) {
              if ((ppVar12->opts).opt[-uVar28] == false) {
                bVar7 = false;
              }
            }
            else if ((ppVar12->opts).opt[uVar28] != false) {
              bVar7 = false;
            }
            uVar28 = *puVar25;
          } while ((uVar28 != 0) && (bVar7));
          if (!bVar7) goto LAB_00242008;
        }
        obj = object_new();
        object_prep(obj,kind,L'\0',MINIMISE);
        obj->number = uVar15;
        obj->origin = '\x12';
        poVar26 = object_new();
        obj->known = poVar26;
        object_set_base_known(ppVar12,obj);
        object_flavor_aware(ppVar12,obj);
        poVar26 = obj->known;
        poVar26->pval = obj->pval;
        poVar26->effect = obj->effect;
        poVar26->notice = poVar26->notice | 2;
        wVar20 = object_value_real(obj,(uint)obj->number);
        ppVar12->au = ppVar12->au - wVar20;
        inven_carry(ppVar12,obj,true,false);
        kind->everseen = true;
      }
LAB_00242008:
      psVar32 = psVar32->next;
    } while (psVar32 != (start_item *)0x0);
  }
  if (ppVar12->au < 0) {
    ppVar12->au = 0;
  }
  wield_all(ppVar12);
  update_player_object_knowledge(ppVar12);
  ppVar5 = player->upkeep;
  ppVar5->generate_level = true;
  ppVar5->playing = true;
  my_strcpy(local_e0.arg[0].name,"choice",0x14);
  local_e0.arg[0].data.choice = 1;
  do_cmd_reset_stats(&local_e0);
  store_reset();
  chunk_list_max = 0;
  cleanup_parser(&randart_parser);
  deactivate_randart_file();
  run_parser(&artifact_parser);
  if ((player->opts).opt[0x1e] == true) {
    seed_randart = Rand_div(0x10000000);
    do_randart(seed_randart,true);
    deactivate_randart_file();
  }
  Term_fresh();
  borg_prepare_race_class_info();
  borg_notice_player();
  borg_note("# Respawning");
  ppVar12 = player;
  borg_respawning = 5;
  piVar1 = &player->msp;
  player->chp = player->mhp;
  ppVar12->csp = *piVar1;
  ppVar12->upkeep->energy_use = L'd';
  ppVar5 = ppVar11->upkeep;
  ppVar5->notice = 0;
  ppVar5->update = 0;
  ppVar5->redraw = 0;
  cave = pcVar10;
  ppVar12->cave = pcVar3;
  ppVar12->grid = lVar4;
  character_generated = true;
  if ((ppVar12->noscore & 0x20) == 0) {
    ppVar12->noscore = ppVar12->noscore | 0x20;
  }
  return;
}

Assistant:

void reincarnate_borg(void)
{
    char           buf[80];
    int            i;
    struct player *p = player;

    /* save the existing dungeon.  It is cleared later but needs to */
    /* be blank when  creating the new player */
    struct chunk* sv_cave = cave;
    struct chunk* sv_player_cave = player->cave;
    struct loc sv_grid = player->grid;

    cave = NULL;
    player->cave = NULL;

    /* Cheat death */
    borg.trait[BI_MAXDEPTH]  = 0;
    borg.trait[BI_MAXCLEVEL] = 1;

    /* Flush message buffer */
    borg_parse(NULL);
    borg_clear_reactions();

    /* flush the commands */
    borg_flush();

    /*** Wipe the player ***/
    player_init(player);

    borg.trait[BI_ISCUT] = borg.trait[BI_ISSTUN] = borg.trait[BI_ISHEAVYSTUN]
        = borg.trait[BI_ISIMAGE] = borg.trait[BI_ISSTUDY] = false;

    /* reset our panel clock */
    borg.time_this_panel = 1;

    /* reset our vault/unique check */
    vault_on_level    = false;
    unique_on_level   = 0;
    scaryguy_on_level = false;

    /* reset our breeder flag */
    breeder_level = false;

    /* Assume not leaving the level */
    borg.goal.leaving = false;

    /* Assume not fleeing the level */
    borg.goal.fleeing = false;

    /* Assume not fleeing the level */
    borg.goal.fleeing_to_town = false;

    /* Assume not ignoring monsters */
    borg.goal.ignoring = false;

    flavor_init();

    /** Roll up a new character **/
    struct player_race  *p_race  = NULL;
    struct player_class *p_class = NULL;
    if (borg_cfg[BORG_RESPAWN_RACE] != -1)
        p_race = player_id2race(borg_cfg[BORG_RESPAWN_RACE]);
    else
        p_race = player_id2race(randint0(MAX_RACES));
    if (borg_cfg[BORG_RESPAWN_CLASS] != -1)
        p_class = player_id2class(borg_cfg[BORG_RESPAWN_CLASS]);
    else
        p_class = player_id2class(randint0(MAX_CLASSES));
    player_generate(player, p_race, p_class, false);

    /* The dungeon is not ready nor is the player */
    character_dungeon   = false;
    character_generated = false;

    /* Start in town */
    player->depth = 0;

    /* Hack -- seed for flavors */
    seed_flavor = randint0(0x10000000);

    /* Embody */
    memcpy(&p->body, &bodies[p->race->body], sizeof(p->body));
    my_strcpy(buf, bodies[p->race->body].name, sizeof(buf));
    p->body.name  = string_make(buf);
    p->body.slots = mem_zalloc(p->body.count * sizeof(struct equip_slot));
    for (i = 0; i < p->body.count; i++) {
        p->body.slots[i].type = bodies[p->race->body].slots[i].type;
        my_strcpy(buf, bodies[p->race->body].slots[i].name, sizeof(buf));
        p->body.slots[i].name = string_make(buf);
    }

    /* Get a random name */
    create_random_name(
        player->race->ridx, player->full_name, sizeof(player->full_name));

    /* Give the player some money */
    player->au = player->au_birth = z_info->start_gold;

    /* Hack - need some HP */
    borg_roll_hp();

    /* Hack - player knows all combat runes.  Maybe make them not runes? NRM */
    player->obj_k->to_a = 1;
    player->obj_k->to_h = 1;
    player->obj_k->to_d = 1;

    /* Player learns innate runes */
    player_learn_innate(player);

    /* Initialise the spells */
    player_spells_init(player);

    /* outfit the player */
    borg_outfit_player(player);

    /* generate town */
    player->upkeep->generate_level = true;
    player->upkeep->playing        = true;

    struct command fake_cmd;
    /* fake up a command */
    my_strcpy(fake_cmd.arg[0].name, "choice", sizeof(fake_cmd.arg[0].name));
    fake_cmd.arg[0].data.choice = 1;
    do_cmd_reset_stats(&fake_cmd);

    /* Initialise the stores, dungeon */
    store_reset();
    chunk_list_max = 0;

    /* Restore the standard artifacts (randarts may have been loaded) */
    cleanup_parser(&randart_parser);
    deactivate_randart_file();
    run_parser(&artifact_parser);

    /* Now only randomize the artifacts if required */
    if (OPT(player, birth_randarts)) {
        seed_randart = randint0(0x10000000);
        do_randart(seed_randart, true);
        deactivate_randart_file();
    }

    /* Hack -- flush it */
    Term_fresh();

    /*** Hack -- react to race and class ***/

    /* Notice the new race and class */
    borg_prepare_race_class_info();

#if false
    /* need to check all stats */
    for (int tmp_i = 0; tmp_i < STAT_MAX; tmp_i++)
        my_need_stat_check[tmp_i] = true;
#endif

    borg_notice_player();

    /* Message */
    borg_note("# Respawning");
    borg_respawning = 5;

    /* fully healed and rested */
    player->chp = player->mhp;
    player->csp = player->msp;
    player->upkeep->energy_use = 100;

    /* don't notice or update immediately */
    p->upkeep->notice = 0;
    p->upkeep->update = 0;
    p->upkeep->redraw = 0;

    /* restore the cave */
    cave = sv_cave;
    player->cave = sv_player_cave;
    player->grid = sv_grid;

    /* the new player is now ready */
    character_generated = true;

    /* Mark savefile as borg cheater */
    if (!(player->noscore & NOSCORE_BORG))
        player->noscore |= NOSCORE_BORG;

    /* Done.  Play on */
}